

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGhostObject.h
# Opt level: O0

btBroadphasePair * __thiscall
btGhostPairCallback::addOverlappingPair
          (btGhostPairCallback *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  btGhostObject *pbVar1;
  btGhostObject *pbVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  btGhostObject *ghost1;
  btGhostObject *ghost0;
  btCollisionObject *colObj1;
  btCollisionObject *colObj0;
  btCollisionObject *in_stack_ffffffffffffffc8;
  
  pbVar1 = btGhostObject::upcast(in_stack_ffffffffffffffc8);
  pbVar2 = btGhostObject::upcast(in_stack_ffffffffffffffc8);
  if (pbVar1 != (btGhostObject *)0x0) {
    (*(pbVar1->super_btCollisionObject)._vptr_btCollisionObject[7])(pbVar1,in_RDX,in_RSI);
  }
  if (pbVar2 != (btGhostObject *)0x0) {
    (*(pbVar2->super_btCollisionObject)._vptr_btCollisionObject[7])(pbVar2,in_RSI,in_RDX);
  }
  return (btBroadphasePair *)0x0;
}

Assistant:

virtual btBroadphasePair*	addOverlappingPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1)
	{
		btCollisionObject* colObj0 = (btCollisionObject*) proxy0->m_clientObject;
		btCollisionObject* colObj1 = (btCollisionObject*) proxy1->m_clientObject;
		btGhostObject* ghost0 = 		btGhostObject::upcast(colObj0);
		btGhostObject* ghost1 = 		btGhostObject::upcast(colObj1);
		if (ghost0)
			ghost0->addOverlappingObjectInternal(proxy1, proxy0);
		if (ghost1)
			ghost1->addOverlappingObjectInternal(proxy0, proxy1);
		return 0;
	}